

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_mdtm(connectdata *conn)

{
  CURLcode CVar1;
  
  if (((((conn->data->set).field_0x979 & 2) != 0) ||
      ((conn->data->set).timecondition != CURL_TIMECOND_NONE)) &&
     ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MDTM %s");
    if (CVar1 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_MDTM;
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_type(conn);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_mdtm(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* Requested time of file or time-depended transfer? */
  if((data->set.get_filetime || data->set.timecondition) && ftpc->file) {

    /* we have requested to get the modified-time of the file, this is a white
       spot as the MDTM is not mentioned in RFC959 */
    result = Curl_pp_sendf(&ftpc->pp, "MDTM %s", ftpc->file);

    if(!result)
      state(conn, FTP_MDTM);
  }
  else
    result = ftp_state_type(conn);

  return result;
}